

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void __thiscall
Test_TemplateModifiers_HtmlEscape::Test_TemplateModifiers_HtmlEscape
          (Test_TemplateModifiers_HtmlEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, HtmlEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestHtmlEscape", NULL);
  dict.SetEscapedValue("easy HTML", "foo",
                       GOOGLE_NAMESPACE::html_escape);
  dict.SetEscapedValue("harder HTML", "foo & bar",
                       GOOGLE_NAMESPACE::html_escape);
  dict.SetEscapedValue("hardest HTML",
                       "<A HREF='foo'\nid=\"bar\t\t&&\vbaz\">",
                       GOOGLE_NAMESPACE::html_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  // TODO(csilvers): change this (and all other expect_*'s in all files
  // in this directory) to take the expected value first, not second.
  EXPECT_STREQ(peer.GetSectionValue("easy HTML"), "foo");
  EXPECT_STREQ(peer.GetSectionValue("harder HTML"), "foo &amp; bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest HTML"),
               "&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; "
               "baz&quot;&gt;");
}